

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-client.c
# Opt level: O0

int callback_test_raw_client(lws *wsi,lws_callback_reasons reason,void *user,void *in,size_t len)

{
  size_t len_local;
  void *in_local;
  void *user_local;
  lws_callback_reasons reason_local;
  lws *wsi_local;
  
  switch(reason) {
  case LWS_CALLBACK_RAW_RX:
    _lws_log(4,"LWS_CALLBACK_RAW_RX %ld\n",len);
    puts((char *)in);
    break;
  case LWS_CALLBACK_RAW_CLOSE:
    _lws_log(4,"LWS_CALLBACK_RAW_CLOSE\n");
    break;
  case LWS_CALLBACK_RAW_WRITEABLE:
    _lws_log(4,"LWS_CALLBACK_RAW_WRITEABLE\n");
    break;
  case LWS_CALLBACK_RAW_ADOPT:
    _lws_log(4,"LWS_CALLBACK_RAW_ADOPT\n");
  }
  return 0;
}

Assistant:

static int
callback_test_raw_client(struct lws *wsi, enum lws_callback_reasons reason,
			 void *user, void *in, size_t len)
{
	switch (reason) {
	case LWS_CALLBACK_RAW_ADOPT:
		lwsl_notice("LWS_CALLBACK_RAW_ADOPT\n");
		break;

	case LWS_CALLBACK_RAW_RX:
		lwsl_notice("LWS_CALLBACK_RAW_RX %ld\n", (long)len);
		puts(in);
		break;

	case LWS_CALLBACK_RAW_CLOSE:
		lwsl_notice("LWS_CALLBACK_RAW_CLOSE\n");
		break;

	case LWS_CALLBACK_RAW_WRITEABLE:
		lwsl_notice("LWS_CALLBACK_RAW_WRITEABLE\n");
		break;

	default:
		break;
	}

	return 0;
}